

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

htmlDocPtr htmlCtxtReadDoc(htmlParserCtxtPtr ctxt,xmlChar *cur,char *URL,char *encoding,int options)

{
  xmlParserInputPtr value;
  xmlParserInputPtr stream;
  int options_local;
  char *encoding_local;
  char *URL_local;
  xmlChar *cur_local;
  htmlParserCtxtPtr ctxt_local;
  
  if (cur == (xmlChar *)0x0) {
    ctxt_local = (htmlParserCtxtPtr)0x0;
  }
  else if (ctxt == (htmlParserCtxtPtr)0x0) {
    ctxt_local = (htmlParserCtxtPtr)0x0;
  }
  else {
    xmlInitParser();
    htmlCtxtReset(ctxt);
    value = xmlNewStringInputStream(ctxt,cur);
    if (value == (xmlParserInputPtr)0x0) {
      ctxt_local = (htmlParserCtxtPtr)0x0;
    }
    else {
      inputPush(ctxt,value);
      ctxt_local = (htmlParserCtxtPtr)htmlDoRead(ctxt,URL,encoding,options,1);
    }
  }
  return (htmlDocPtr)ctxt_local;
}

Assistant:

htmlDocPtr
htmlCtxtReadDoc(htmlParserCtxtPtr ctxt, const xmlChar * cur,
               const char *URL, const char *encoding, int options)
{
    xmlParserInputPtr stream;

    if (cur == NULL)
        return (NULL);
    if (ctxt == NULL)
        return (NULL);
    xmlInitParser();

    htmlCtxtReset(ctxt);

    stream = xmlNewStringInputStream(ctxt, cur);
    if (stream == NULL) {
        return (NULL);
    }
    inputPush(ctxt, stream);
    return (htmlDoRead(ctxt, URL, encoding, options, 1));
}